

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zcc-parse.c
# Opt level: O2

int yy_find_reduce_action(int stateno,uchar iLookAhead)

{
  ushort *puVar1;
  uint uVar2;
  
  if (stateno < 0x83) {
    if (iLookAhead == 0xda) {
      __assert_fail("iLookAhead!=YYNOCODE",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/build_O2/src/zcc-parse.c"
                    ,0x6a7,"int yy_find_reduce_action(int, unsigned char)");
    }
    uVar2 = (uint)iLookAhead + (int)yy_reduce_ofst[(uint)stateno];
    if ((uVar2 < 0x880) && (yy_lookahead[uVar2] == iLookAhead)) {
      puVar1 = yy_action + uVar2;
      goto LAB_0060773d;
    }
  }
  puVar1 = yy_default + (uint)stateno;
LAB_0060773d:
  return (int)*puVar1;
}

Assistant:

static int yy_find_reduce_action(
  int stateno,              /* Current state number */
  YYCODETYPE iLookAhead     /* The look-ahead token */
){
  int i;
#ifdef YYERRORSYMBOL
  if( stateno>YY_REDUCE_COUNT ){
	return yy_default[stateno];
  }
#else
  assert( stateno<=YY_REDUCE_COUNT );
#endif
  i = yy_reduce_ofst[stateno];
  assert( i!=YY_REDUCE_USE_DFLT );
  assert( iLookAhead!=YYNOCODE );
  i += iLookAhead;
#ifdef YYERRORSYMBOL
  if( i<0 || i>=YY_ACTTAB_COUNT || yy_lookahead[i]!=iLookAhead ){
    return yy_default[stateno];
  }
#else
  assert( i>=0 && i<YY_ACTTAB_COUNT );
  assert( yy_lookahead[i]==iLookAhead );
#endif
  return yy_action[i];
}